

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

int __thiscall LPCMStreamReader::readPacket(LPCMStreamReader *this,AVPacket *avPacket)

{
  uint8_t **ppuVar1;
  int64_t *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint8_t *puVar6;
  ostream *poVar7;
  longlong lVar8;
  size_t __n;
  int64_t iVar9;
  undefined4 *puVar10;
  uint uVar11;
  uint8_t *puVar12;
  pointer __dest;
  ulong uVar13;
  double __x;
  int skipBeforeBytes;
  int skipBytes;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  ostringstream ss;
  
  avPacket->flags = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_flags;
  avPacket->stream_index =
       (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_streamIndex;
  avPacket->codecID = ::lpcmCodecInfo.codecID;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->duration = 0;
  __x = (this->super_SimplePacketizerReader).m_curPts *
        (this->super_SimplePacketizerReader).m_stretch;
  lVar5 = (long)__x + (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_timeOffset;
  avPacket->pts = lVar5;
  avPacket->dts = lVar5;
  puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  puVar6 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  if (puVar6 < puVar12) {
    __assert_fail("m_curPos <= m_bufEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                  ,0x304,"virtual int LPCMStreamReader::readPacket(AVPacket &)");
  }
  if (puVar12 == puVar6) {
    return 1;
  }
  skipBytes = 0;
  skipBeforeBytes = 0;
  if ((this->super_SimplePacketizerReader).m_needSync == true) {
    puVar6 = findFrame(this,puVar12,puVar6);
    puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
    if (puVar6 == (uint8_t *)0x0) {
      piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
      *piVar2 = (int64_t)(puVar12 +
                         (*piVar2 -
                         (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_curPos));
      return 1;
    }
    iVar3 = decodeFrame(this,puVar6,puVar12,&skipBytes,&skipBeforeBytes);
    if (iVar3 == -10) {
      puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      memcpy((this->super_SimplePacketizerReader).m_tmpBuffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,puVar12,
             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
             (long)puVar12);
      goto LAB_001a6361;
    }
    puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
    iVar4 = iVar3 + skipBytes + skipBeforeBytes;
    if (iVar4 == 0 || SCARRY4(iVar3 + skipBytes,skipBeforeBytes) != iVar4 < 0) {
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar12 + 1;
      piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
      *piVar2 = *piVar2 + 1;
      return 0;
    }
    piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
    *piVar2 = (int64_t)(puVar6 + (*piVar2 - (long)puVar12));
    poVar7 = std::operator<<((ostream *)&std::cout,"Decoding ");
    poVar7 = std::operator<<(poVar7,(string *)&::lpcmCodecInfo.displayName);
    poVar7 = std::operator<<(poVar7," stream (track ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    poVar7 = std::operator<<(poVar7,"): ");
    getStreamInfo_abi_cxx11_((string *)&ss,this);
    poVar7 = std::operator<<(poVar7,(string *)&ss);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&ss);
    sLastMsg = true;
    (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar6;
    (this->super_SimplePacketizerReader).m_needSync = false;
    __x = (this->super_SimplePacketizerReader).m_curPts *
          (this->super_SimplePacketizerReader).m_stretch;
  }
  lVar8 = llround(__x);
  lVar5 = lVar8 + (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_timeOffset;
  avPacket->pts = lVar5;
  avPacket->dts = lVar5;
  puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  puVar6 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  __n = (long)puVar6 - (long)puVar12;
  if ((long)__n < 4) {
    __dest = (this->super_SimplePacketizerReader).m_tmpBuffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    skipBytes = 0;
    skipBeforeBytes = 0;
    iVar3 = decodeFrame(this,puVar12,puVar6,&skipBytes,&skipBeforeBytes);
    if (iVar3 == -10) {
      __dest = (this->super_SimplePacketizerReader).m_tmpBuffer.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      __n = (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
            (long)puVar12;
    }
    else {
      uVar11 = skipBeforeBytes + skipBytes + iVar3;
      if (uVar11 == 0 || SCARRY4(skipBeforeBytes,skipBytes + iVar3) != (int)uVar11 < 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)&::lpcmCodecInfo.displayName);
        poVar7 = std::operator<<(poVar7," bad frame detected. Resync stream.");
        std::endl<char,std::char_traits<char>>(poVar7);
        sLastMsg = true;
        (this->super_SimplePacketizerReader).m_needSync = true;
        return 0;
      }
      puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      __n = (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
            (long)puVar12;
      uVar13 = (ulong)uVar11;
      if ((long)uVar13 <= (long)__n) {
        avPacket->data = puVar12 + skipBeforeBytes;
        if (this->m_curChunkLen != 0) {
          this->m_curChunkLen = this->m_curChunkLen - (long)iVar3;
        }
        if (0x8000 < iVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar7 = std::operator<<((ostream *)&ss,"AV frame too large (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
          std::operator<<(poVar7," bytes). Increase AV buffer.");
          puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar10 = 800;
          *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
          if (local_1c8 == &local_1b8) {
            *(ulong *)(puVar10 + 6) = CONCAT71(uStack_1b7,local_1b8);
            *(undefined8 *)(puVar10 + 8) = uStack_1b0;
          }
          else {
            *(undefined1 **)(puVar10 + 2) = local_1c8;
            *(ulong *)(puVar10 + 6) = CONCAT71(uStack_1b7,local_1b8);
          }
          *(undefined8 *)(puVar10 + 4) = local_1c0;
          local_1c0 = 0;
          local_1b8 = 0;
          local_1c8 = &local_1b8;
          __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        avPacket->size = iVar3;
        iVar9 = 0x193bf60;
        if (this->m_frameRest != 0) {
          iVar9 = 0;
        }
        avPacket->duration = iVar9;
        (this->super_SimplePacketizerReader).m_curPts =
             (double)(int)iVar9 + (this->super_SimplePacketizerReader).m_curPts;
        SimplePacketizerReader::doMplsCorrection(&this->super_SimplePacketizerReader);
        if (((this->m_headerType & ~htM2TS) == htWAVE) &&
           ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_demuxMode == false)) {
          iVar3 = convertWavToPCM(this,avPacket->data,avPacket->data + avPacket->size);
          avPacket->size = iVar3;
          avPacket->data = this->m_tmpFrameBuffer;
        }
        ppuVar1 = &(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
        *ppuVar1 = *ppuVar1 + uVar13;
        (this->super_SimplePacketizerReader).m_processedBytes =
             uVar13 + (this->super_SimplePacketizerReader).m_processedBytes;
        (this->super_SimplePacketizerReader).m_frameNum =
             (this->super_SimplePacketizerReader).m_frameNum + 1;
        if (this->m_frameRest == 0) {
          avPacket->flags =
               (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_flags + 6;
          return 0;
        }
        return 0;
      }
      __dest = (this->super_SimplePacketizerReader).m_tmpBuffer.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  memmove(__dest,puVar12,__n);
LAB_001a6361:
  puVar12 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
       (long)puVar12 -
       (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar12;
  return 1;
}

Assistant:

int LPCMStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.flags = m_flags;  // + AVPacket::IS_COMPLETE_FRAME | AVPacket::FORCE_NEW_FRAME;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;
    avPacket.codec = this;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.duration = 0;
    avPacket.dts = avPacket.pts = static_cast<int64_t>(m_curPts * m_stretch) + m_timeOffset;
    assert(m_curPos <= m_bufEnd);
    if (m_curPos == m_bufEnd)
        return NEED_MORE_DATA;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    if (m_needSync)
    {
        uint8_t* frame = findFrame(m_curPos, m_bufEnd);
        if (frame == nullptr)
        {
            m_processedBytes += m_bufEnd - m_curPos;
            return NEED_MORE_DATA;
        }
        const int decodeRez = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
        if (decodeRez == NOT_ENOUGH_BUFFER)
        {
            memcpy(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
            m_tmpBufferLen = m_bufEnd - m_curPos;
            m_curPos = m_bufEnd;
            return NEED_MORE_DATA;
        }
        if (decodeRez + skipBytes + skipBeforeBytes <= 0)
        {
            m_curPos++;
            m_processedBytes++;
            return 0;
        }
        m_processedBytes += frame - m_curPos;
        LTRACE(LT_INFO, 2,
               "Decoding " << getCodecInfo().displayName << " stream (track " << m_streamIndex
                           << "): " << getStreamInfo());
        m_curPos = frame;
        m_needSync = false;
    }
    avPacket.dts = avPacket.pts = llround(m_curPts * m_stretch) + m_timeOffset;
    if (m_bufEnd - m_curPos < getHeaderLen())
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    skipBytes = 0;
    skipBeforeBytes = 0;
    const int frameLen = decodeFrame(m_curPos, m_bufEnd, skipBytes, skipBeforeBytes);
    if (frameLen == NOT_ENOUGH_BUFFER)
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    if (frameLen + skipBytes + skipBeforeBytes <= 0)
    {
        LTRACE(LT_INFO, 2, getCodecInfo().displayName << " bad frame detected. Resync stream.");
        m_needSync = true;
        return 0;
    }
    if (m_bufEnd - m_curPos < frameLen + skipBytes + skipBeforeBytes)
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    avPacket.data = m_curPos;
    avPacket.data += skipBeforeBytes;
    if (m_curChunkLen)
        m_curChunkLen -= frameLen;
    if (frameLen > MAX_AV_PACKET_SIZE)
        THROW(ERR_AV_FRAME_TOO_LARGE, "AV frame too large (" << frameLen << " bytes). Increase AV buffer.")
    avPacket.size = frameLen;
    avPacket.duration = static_cast<int64_t>(getFrameDuration());  // m_ptsIncPerFrame;
    m_curPts += static_cast<double>(avPacket.duration);
    doMplsCorrection();
    if ((m_headerType == LPCMHeaderType::htWAVE || m_headerType == LPCMHeaderType::htWAVE64) && !m_demuxMode)
    {
        avPacket.size = convertWavToPCM(avPacket.data, avPacket.data + avPacket.size);
        avPacket.data = m_tmpFrameBuffer;
    }

    m_frameNum++;
    if (m_frameNum % 1000 == 0)
        LTRACE(LT_DEBUG, 0, "Processed " << m_frameNum << " " << getCodecInfo().displayName << " frames");
    m_curPos += frameLen + skipBytes + skipBeforeBytes;
    m_processedBytes += frameLen + skipBytes + skipBeforeBytes;
    if (m_frameRest == 0)
        avPacket.flags = m_flags + (AVPacket::IS_COMPLETE_FRAME | AVPacket::FORCE_NEW_FRAME);
    return 0;
}